

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O1

bool __thiscall string_view::operator==(string_view *this,string_view *other)

{
  int iVar1;
  bool bVar2;
  string this_str;
  string other_str;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  long *local_28;
  size_t local_20;
  long local_18 [2];
  
  std::__cxx11::string::substr((ulong)&local_48,(ulong)this->_str);
  std::__cxx11::string::substr((ulong)&local_28,(ulong)other->_str);
  if (local_40 == local_20) {
    if (local_40 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_48,local_28,local_40);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar2;
}

Assistant:

bool operator==(const string_view & other) const {
        std::string this_str = *this;
        std::string other_str = other;
        return this_str == other_str;
    }